

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsComplex helicsInputGetComplexObject(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  HelicsComplex HVar5;
  
  pIVar1 = anon_unknown.dwarf_7c49a::verifyInput(inp,err);
  uVar2 = 0xfaf472ca;
  uVar3 = 0xc814fb89;
  if (pIVar1 == (InputObject *)0x0) {
    dVar4 = -1.785e+39;
  }
  else {
    helics::Input::getValue_impl<std::complex<double>>(pIVar1->inputPtr);
    uVar2 = 0;
    uVar3 = 0;
    dVar4 = 0.0;
  }
  HVar5.real._4_4_ = uVar3;
  HVar5.real._0_4_ = uVar2;
  HVar5.imag = dVar4;
  return HVar5;
}

Assistant:

HelicsComplex helicsInputGetComplexObject(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);

    if (inpObj == nullptr) {
        // time invalid is just an invalid double
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }

    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        return {cval.real(), cval.imag()};
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }
    // LCOV_EXCL_STOP
}